

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O1

void scan_ranges(void)

{
  rtosc_print_options simplefloats;
  rtosc_print_options uncompressed;
  rtosc_print_options local_40;
  rtosc_print_options local_28;
  
  local_28.lossless = false;
  local_28.floating_point_precision = 3;
  local_28.sep = " ";
  local_28.linelength = 0x50;
  local_28.compress_ranges = 0;
  local_40.lossless = false;
  local_40.floating_point_precision = 2;
  local_40.sep = " ";
  local_40.linelength = 0x50;
  local_40.compress_ranges = 1;
  check_alt("0 1 2 3",(rtosc_print_options *)0x0,"too less args for range conversion",0x1a6,
            (char *)0x0);
  check_alt("0.00 1.00 2.00 3.00 4.00",&local_40,"wrong type for range conversion",0x1a8,(char *)0x0
           );
  check_alt("0 1 2 3 4",&local_28,"no range conversion due to opts",0x1aa,(char *)0x0);
  check_alt("1 2 3 4 5 6 7",(rtosc_print_options *)0x0,"convert to simple upwards integer range",
            0x1b0,"1 ... 7");
  check_alt("-3 -4 -5 -6 -7",(rtosc_print_options *)0x0,"convert to simple downwards integer range",
            0x1b3,"-3 ... -7");
  check_alt("\'z\' \'x\' \'v\' \'t\' \'r\'",(rtosc_print_options *)0x0,
            "convert to simple downward char range",0x1b6,"\'z\' \'x\' ... \'r\'");
  check_alt("[4 3 2 1 0]",(rtosc_print_options *)0x0,"convert to downward range in an array",0x1b9,
            "[4 ... 0]");
  check_alt("1 3 5 7 9 13 15 17 19 21",(rtosc_print_options *)0x0,
            "convert to two almost subsequent ranges",0x1bc,"1 3 ... 9 13 15 ... 21");
  check_alt("[ 1 2 3 4 5 ]",(rtosc_print_options *)0x0,"convert to range with delta 1 in an array",
            0x1bf,"[1 ... 5]");
  check_alt("[5 4 3 2 1 0]",(rtosc_print_options *)0x0,"convert to range with delta -1 in an array",
            0x1c2,"[5 ... 0]");
  check_alt("0 0 0 0 0",(rtosc_print_options *)0x0,"convert to range of 5 zeros",0x1c9,"5x0");
  check_alt("[ 0h 0h 0h 0h 0h ]",(rtosc_print_options *)0x0,
            "convert to array with range of 5 huge ints",0x1cb,"[5x0h]");
  check_alt("[0 1] [0 1] [0 1] [0 1] [0 1]",(rtosc_print_options *)0x0,"convert to range of arrays",
            0x1cd,"5x[0 1]");
  check_alt("0.5 0.5 0.5 0.5 0.5 \'a\' \'b\' \'c\' \'d\' \'e\'",(rtosc_print_options *)0x0,
            "convert to combined ranges",0x1d2,"5x0.50 (0x1p-1) \'a\' ... \'e\'");
  return;
}

Assistant:

void scan_ranges()
{
    /*
        no range conversion
     */
    auto uncompressed = make_print_options(false, 3, " ", 80, false);
    auto simplefloats = make_print_options(false, 2, " ", 80, true);
    check("0 1 2 3", NULL, "too less args for range conversion", __LINE__);
    check("0.00 1.00 2.00 3.00 4.00", &simplefloats,
          "wrong type for range conversion", __LINE__);
    check("0 1 2 3 4", &uncompressed,
          "no range conversion due to opts", __LINE__);

    /*
        with delta
     */
    check_alt("1 2 3 4 5 6 7", NULL,
              "convert to simple upwards integer range", __LINE__,
              "1 ... 7");
    check_alt("-3 -4 -5 -6 -7", NULL,
              "convert to simple downwards integer range", __LINE__,
              "-3 ... -7");
    check_alt("'z' 'x' 'v' 't' 'r'", NULL,
              "convert to simple downward char range", __LINE__,
              "'z' 'x' ... 'r'");
    check_alt("[4 3 2 1 0]", NULL,
              "convert to downward range in an array", __LINE__,
              "[4 ... 0]");
    check_alt("1 3 5 7 9 13 15 17 19 21", NULL,
              "convert to two almost subsequent ranges", __LINE__,
              "1 3 ... 9 13 15 ... 21");
    check_alt("[ 1 2 3 4 5 ]", NULL,
              "convert to range with delta 1 in an array", __LINE__,
              "[1 ... 5]");
    check_alt("[5 4 3 2 1 0]", NULL,
              "convert to range with delta -1 in an array", __LINE__,
              "[5 ... 0]");

    /*
        without delta
     */
    check_alt("0 0 0 0 0", NULL,
              "convert to range of 5 zeros", __LINE__, "5x0");
    check_alt("[ 0h 0h 0h 0h 0h ]", NULL,
              "convert to array with range of 5 huge ints", __LINE__, "[5x0h]");
    check_alt("[0 1] [0 1] [0 1] [0 1] [0 1]", NULL,
              "convert to range of arrays", __LINE__, "5x[0 1]");
    /*
        combined
     */
    check_alt("0.5 0.5 0.5 0.5 0.5 'a' 'b' 'c' 'd' 'e'", NULL,
              "convert to combined ranges", __LINE__,
              "5x0.50 (0x1p-1) 'a' ... 'e'");
    /* combined, but not yet implemented: */
#if 0
    check_alt("-6 -6 -6 -6 -6 -6 -5 -4 ... 0", NULL,
              "convert to combined ranges (2)", __LINE__,
              "6x-6 -5 ... 0");
    check_alt("'a' 'b' 'c' 'd' 'e' 'f' 'f' 'f' 'f' 'f' 'f'", NULL,
              "convert to combined ranges (3)", __LINE__,
              "'a' ... 'f' 6x'f'");
#endif

    /*
        endless ranges
     */
    // (you cannot convert fixed size ranges to endless ranges)
}